

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::UniversalTersePrinter<const_wchar_t_*>::Print(wchar_t *str,ostream *os)

{
  allocator local_31;
  wstring local_30;
  
  if (str != (wchar_t *)0x0) {
    std::__cxx11::wstring::wstring((wstring *)&local_30,str,&local_31);
    PrintWideStringTo(&local_30,os);
    std::__cxx11::wstring::~wstring((wstring *)&local_30);
    return;
  }
  std::operator<<(os,"NULL");
  return;
}

Assistant:

static void Print(const wchar_t* str, ::std::ostream* os) {
    if (str == nullptr) {
      *os << "NULL";
    } else {
      UniversalPrint(::std::wstring(str), os);
    }
  }